

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es32cRobustBufferAccessBehaviorTests.cpp
# Opt level: O1

bool __thiscall
es32cts::RobustBufferAccessBehavior::UniformBufferTest::verifyResults
          (UniformBufferTest *this,GLfloat *buffer_data)

{
  ostringstream *this_00;
  VERSION VVar1;
  bool bVar2;
  size_t sVar3;
  TestError *this_01;
  GLfloat *pGVar4;
  char *__s;
  undefined1 auVar5 [16];
  undefined1 local_190 [120];
  ios_base local_118 [264];
  
  VVar1 = (this->super_UniformBufferTest).m_test_case;
  if (VVar1 == VALID) {
    pGVar4 = verifyResults::expected_data_valid;
    __s = "valid indices";
  }
  else {
    if (VVar1 != SOURCE_INVALID) {
      this_01 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (this_01,"Invalid enum",(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles32/es32cRobustBufferAccessBehaviorTests.cpp"
                 ,0x54b);
      __cxa_throw(this_01,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
    }
    pGVar4 = verifyResults::expected_data_invalid_source;
    __s = "invalid source indices";
  }
  bVar2 = true;
  if ((VVar1 == VALID) &&
     (auVar5[0] = -(*(char *)buffer_data == *(char *)pGVar4),
     auVar5[1] = -(*(char *)((long)buffer_data + 1) == *(char *)((long)pGVar4 + 1)),
     auVar5[2] = -(*(char *)((long)buffer_data + 2) == *(char *)((long)pGVar4 + 2)),
     auVar5[3] = -(*(char *)((long)buffer_data + 3) == *(char *)((long)pGVar4 + 3)),
     auVar5[4] = -(*(char *)(buffer_data + 1) == *(char *)(pGVar4 + 1)),
     auVar5[5] = -(*(char *)((long)buffer_data + 5) == *(char *)((long)pGVar4 + 5)),
     auVar5[6] = -(*(char *)((long)buffer_data + 6) == *(char *)((long)pGVar4 + 6)),
     auVar5[7] = -(*(char *)((long)buffer_data + 7) == *(char *)((long)pGVar4 + 7)),
     auVar5[8] = -(*(char *)(buffer_data + 2) == *(char *)(pGVar4 + 2)),
     auVar5[9] = -(*(char *)((long)buffer_data + 9) == *(char *)((long)pGVar4 + 9)),
     auVar5[10] = -(*(char *)((long)buffer_data + 10) == *(char *)((long)pGVar4 + 10)),
     auVar5[0xb] = -(*(char *)((long)buffer_data + 0xb) == *(char *)((long)pGVar4 + 0xb)),
     auVar5[0xc] = -(*(char *)(buffer_data + 3) == *(char *)(pGVar4 + 3)),
     auVar5[0xd] = -(*(char *)((long)buffer_data + 0xd) == *(char *)((long)pGVar4 + 0xd)),
     auVar5[0xe] = -(*(char *)((long)buffer_data + 0xe) == *(char *)((long)pGVar4 + 0xe)),
     auVar5[0xf] = -(*(char *)((long)buffer_data + 0xf) == *(char *)((long)pGVar4 + 0xf)),
     (ushort)((ushort)(SUB161(auVar5 >> 7,0) & 1) | (ushort)(SUB161(auVar5 >> 0xf,0) & 1) << 1 |
              (ushort)(SUB161(auVar5 >> 0x17,0) & 1) << 2 |
              (ushort)(SUB161(auVar5 >> 0x1f,0) & 1) << 3 |
              (ushort)(SUB161(auVar5 >> 0x27,0) & 1) << 4 |
              (ushort)(SUB161(auVar5 >> 0x2f,0) & 1) << 5 |
              (ushort)(SUB161(auVar5 >> 0x37,0) & 1) << 6 |
              (ushort)(SUB161(auVar5 >> 0x3f,0) & 1) << 7 |
              (ushort)(SUB161(auVar5 >> 0x47,0) & 1) << 8 |
              (ushort)(SUB161(auVar5 >> 0x4f,0) & 1) << 9 |
              (ushort)(SUB161(auVar5 >> 0x57,0) & 1) << 10 |
              (ushort)(SUB161(auVar5 >> 0x5f,0) & 1) << 0xb |
              (ushort)(SUB161(auVar5 >> 0x67,0) & 1) << 0xc |
              (ushort)(SUB161(auVar5 >> 0x6f,0) & 1) << 0xd |
              (ushort)(SUB161(auVar5 >> 0x77,0) & 1) << 0xe | (ushort)(auVar5[0xf] >> 7) << 0xf) !=
     0xffff)) {
    local_190._0_8_ = ((this->super_UniformBufferTest).super_TestCase.m_context)->m_testCtx->m_log;
    this_00 = (ostringstream *)(local_190 + 8);
    std::__cxx11::ostringstream::ostringstream(this_00);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,"Test case: ",0xb);
    sVar3 = strlen(__s);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,__s,sVar3);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00," failed",7);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_190,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(this_00);
    std::ios_base::~ios_base(local_118);
    bVar2 = false;
  }
  return bVar2;
}

Assistant:

bool UniformBufferTest::verifyResults(GLfloat* buffer_data)
{
	static const GLfloat expected_data_valid[4]			 = { 2.0f, 3.0f, 4.0f, 5.0f };
	static const GLfloat expected_data_invalid_source[4] = { 0.0f, 0.0f, 0.0f, 0.0f };

	int size = sizeof(GLfloat) * 4;

	/* Prepare expected data const for proper case*/
	const GLfloat* expected_data = 0;
	const GLchar*  name			 = 0;
	switch (m_test_case)
	{
	case VALID:
		expected_data = expected_data_valid;
		name		  = "valid indices";
		break;
	case SOURCE_INVALID:
		expected_data = expected_data_invalid_source;
		name		  = "invalid source indices";
		break;
	default:
		TCU_FAIL("Invalid enum");
	}

	/* Verify buffer data */
	if (m_test_case == VALID && memcmp(expected_data, buffer_data, size) != 0)
	{
		m_context.getTestContext().getLog() << tcu::TestLog::Message << "Test case: " << name << " failed"
											<< tcu::TestLog::EndMessage;
		return false;
	}

	return true;
}